

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double beta_inc(double a,double b,double x)

{
  int iVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  if (a <= 0.0) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
    pcVar7 = "  A <= 0.\n";
  }
  else {
    if (0.0 < b) {
      dVar9 = 0.0;
      if ((x <= 0.0) || (dVar9 = 1.0, 1.0 <= x)) {
        return dVar9;
      }
      dVar12 = a + b;
      dVar10 = dVar12 * x;
      dVar14 = 1.0;
      dVar9 = x;
      if (dVar10 <= a) {
        dVar9 = 1.0 - x;
      }
      uVar8 = -(ulong)(a < dVar10);
      __x = 1.0 - x;
      dVar11 = a;
      if (dVar10 <= a) {
        __x = x;
        dVar11 = b;
      }
      dVar15 = (double)(~uVar8 & (ulong)a | uVar8 & (ulong)b);
      iVar4 = (int)(dVar9 * dVar12 + dVar11);
      dVar10 = __x;
      if (iVar4 != 0) {
        dVar10 = __x / dVar9;
      }
      iVar1 = 1;
      dVar16 = 1.0;
      dVar13 = dVar11 + -1.0;
LAB_00194098:
      do {
        iVar3 = 0;
        iVar5 = iVar4;
        do {
          if (iVar1 + iVar3 == 0x3e9) {
            std::operator<<((ostream *)&std::cerr,"\n");
            std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
            std::operator<<((ostream *)&std::cerr,"  Maximum number of iterations exceeded!\n");
            poVar2 = std::operator<<((ostream *)&std::cerr,"  IT_MAX = ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,1000);
            pcVar7 = "\n";
            goto LAB_00194289;
          }
          dVar14 = (dVar14 * dVar13 * dVar10) / ((double)(iVar1 + iVar3) + dVar15);
          dVar16 = dVar16 + dVar14;
          if ((ABS(dVar14) <= 1e-07) && (ABS(dVar14) <= dVar16 * 1e-07)) {
            dVar12 = log(__x);
            dVar9 = log(dVar9);
            dVar9 = exp(dVar9 * (dVar11 + -1.0) + dVar12 * dVar15);
            dVar12 = r8_beta(a,b);
            dVar9 = (dVar16 * dVar9) / (dVar12 * dVar15);
            return (double)((ulong)(1.0 - dVar9) & uVar8 | ~uVar8 & (ulong)dVar9);
          }
          iVar6 = iVar5 + -1;
          if (iVar5 < 1) {
            iVar1 = iVar1 + iVar3 + 1;
            dVar13 = dVar12;
            iVar4 = iVar6;
            dVar12 = dVar12 + 1.0;
            goto LAB_00194098;
          }
          dVar13 = dVar11 - (double)(iVar1 + iVar3 + 1);
          iVar3 = iVar3 + 1;
          iVar5 = iVar6;
        } while (iVar4 != iVar3);
        iVar1 = iVar1 + iVar3;
        dVar10 = __x;
        iVar4 = iVar6;
      } while( true );
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"BETA_INC - Fatal error!\n");
    pcVar7 = "  B <= 0.\n";
  }
  poVar2 = (ostream *)&std::cerr;
LAB_00194289:
  std::operator<<(poVar2,pcVar7);
  exit(1);
}

Assistant:

double beta_inc ( double a, double b, double x )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_INC returns the value of the incomplete Beta function.
//
//  Discussion:
//
//    This calculation requires an iteration.  In some cases, the iteration
//    may not converge rapidly, or may become inaccurate.
//
//    BETA_INC(A,B,X)
//
//      =   Integral ( 0 <= T <= X ) T^(A-1) (1-T)^(B-1) dT
//        / Integral ( 0 <= T <= 1 ) T^(A-1) (1-T)^(B-1) dT
//
//      =   Integral ( 0 <= T <= X ) T^(A-1) (1-T)^(B-1) dT
//        / BETA(A,B)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    10 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by Majumder, Bhattacharjee.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Majumder, Bhattacharjee,
//    Algorithm AS63,
//    Applied Statistics,
//    1973, volume 22, number 3.
//
//  Parameters:
//
//    Input, double A, B, the parameters of the function.
//    0.0 < A,
//    0.0 < B.
//
//    Input, double X, the argument of the function.
//    Normally, 0.0 <= X <= 1.0.
//
//    Output, double BETA_INC, the value of the function.
//
{
  double cx;
  int i;
  int it;
  int it_max = 1000;
  bool indx;
  int ns;
  double pp;
  double psq;
  double qq;
  double rx;
  double temp;
  double term;
  double tol = 1.0E-07;
  double value;
  double xx;

  if ( a <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_INC - Fatal error!\n";
    cerr << "  A <= 0.\n";
    exit ( 1 );
  }

  if ( b <= 0.0 )
  {
    cerr << "\n";
    cerr << "BETA_INC - Fatal error!\n";
    cerr << "  B <= 0.\n";
    exit ( 1 );
  }

  if ( x <= 0.0 )
  {
    value = 0.0;
    return value;
  }
  else if ( 1.0 <= x )
  {
    value = 1.0;
    return value;
  }
//
//  Change tail if necessary and determine S.
//
  psq = a + b;

  if ( a < ( a + b ) * x )
  {
    xx = 1.0 - x;
    cx = x;
    pp = b;
    qq = a;
    indx = true;
  }
  else
  {
    xx = x;
    cx = 1.0 - x;
    pp = a;
    qq = b;
    indx = false;
  }

  term = 1.0;
  i = 1;
  value = 1.0;

  ns = static_cast<int>( qq + cx * ( a + b ) );
//
//  Use Soper's reduction formulas.
//
  rx = xx / cx;

  temp = qq - static_cast<double>(i);
  if ( ns == 0 )
  {
    rx = xx;
  }

  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    if ( it_max < it )
    {
      cerr << "\n";
      cerr << "BETA_INC - Fatal error!\n";
      cerr << "  Maximum number of iterations exceeded!\n";
      cerr << "  IT_MAX = " << it_max << "\n";
      exit ( 1 );
    }

    term = term * temp * rx / ( pp + static_cast<double>(i ) );
    value = value + term;
    temp = fabs ( term );

    if ( temp <= tol && temp <= tol * value )
    {
      break;
    }

    i = i + 1;
    ns = ns - 1;

    if ( 0 <= ns )
    {
      temp = qq - static_cast< double > ( i);
      if ( ns == 0 )
      {
        rx = xx;
      }
    }
    else
    {
      temp = psq;
      psq = psq + 1.0;
    }
  }
//
//  Finish calculation.
//
  value = value * exp ( pp * log ( xx )
    + ( qq - 1.0 ) * log ( cx ) ) / ( r8_beta ( a, b ) * pp );

  if ( indx )
  {
    value = 1.0 - value;
  }

  return value;
}